

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Pubkey * __thiscall
cfd::core::Pubkey::CreateTweakAdd(Pubkey *__return_storage_ptr__,Pubkey *this,ByteData256 *tweak)

{
  Pubkey *this_00;
  ByteData local_50;
  undefined1 local_38 [8];
  ByteData tweak_added;
  ByteData256 *tweak_local;
  Pubkey *this_local;
  
  this_00 = __return_storage_ptr__;
  tweak_added.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)tweak;
  WallyUtil::AddTweakPubkey((ByteData *)local_38,&this->data_,tweak,false);
  ByteData::ByteData(&this_00->data_,&__return_storage_ptr__->data_);
  Pubkey(__return_storage_ptr__,&local_50);
  ByteData::~ByteData((ByteData *)0x44f4bd);
  ByteData::~ByteData((ByteData *)0x44f4c6);
  return this_00;
}

Assistant:

Pubkey Pubkey::CreateTweakAdd(const ByteData256 &tweak) const {
  ByteData tweak_added = WallyUtil::AddTweakPubkey(data_, tweak);
  return Pubkey(tweak_added);
}